

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

byte * __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>
          (SlabAllocatorBase<0> *this,size_t requestedBytes)

{
  Memory *this_00;
  uchar *alloc;
  LargeSlabBlock *newBlock_00;
  LargeSlabBlock *newBlock;
  TrackAllocData local_50;
  LargeSlabBlock *local_28;
  byte *tmp;
  size_t sStack_18;
  uint32 desiredsize;
  size_t requestedBytes_local;
  SlabAllocatorBase<0> *this_local;
  
  sStack_18 = requestedBytes;
  requestedBytes_local = (size_t)this;
  if (requestedBytes < 0x1001) {
    TTDAbort_unrecoverable_error("Don\'t allocate small requests in the large pool.");
  }
  tmp._4_4_ = (int)requestedBytes + 0x2bU & 0xfffffffc;
  if ((ulong)tmp._4_4_ < requestedBytes + 0x28) {
    TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!")
    ;
  }
  if (this->m_reserveActiveBytes != 0) {
    TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_char::typeinfo,0,(ulong)tmp._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTSupport.h"
             ,0x24b);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
  alloc = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                    (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,(ulong)tmp._4_4_
                    );
  newBlock_00 = (LargeSlabBlock *)TTD_MEM_ALLOC_CHECK<unsigned_char>(alloc);
  newBlock_00->BlockData = (byte *)(newBlock_00 + 1);
  newBlock_00->TotalBlockSize = tmp._4_4_;
  newBlock_00->Previous = this->m_largeBlockList;
  newBlock_00->Next = (LargeSlabBlock *)0x0;
  newBlock_00->MetaDataSential = 0;
  local_28 = newBlock_00;
  CommitLargeBlockAllocation(this,newBlock_00,(ulong)tmp._4_4_);
  return newBlock_00->BlockData;
}

Assistant:

byte* SlabAllocateLargeBlockSize(size_t requestedBytes)
        {
            TTDAssert(requestedBytes > TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate small requests in the large pool.");

            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(requestedBytes + TTD_LARGE_SLAB_BLOCK_SIZE); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (requestedBytes + TTD_LARGE_SLAB_BLOCK_SIZE)), "We can never allocate a block this big with the slab allocator!!");

            TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");

            byte* tmp = TT_HEAP_ALLOC_ARRAY(byte, desiredsize);

            LargeSlabBlock* newBlock = (LargeSlabBlock*)tmp;
            newBlock->BlockData = (tmp + TTD_LARGE_SLAB_BLOCK_SIZE);

            newBlock->TotalBlockSize = desiredsize;
            newBlock->Previous = this->m_largeBlockList;
            newBlock->Next = nullptr;

            newBlock->MetaDataSential = 0;

            if (commit)
            {
                this->CommitLargeBlockAllocation(newBlock, desiredsize);
            }
            else
            {
                this->m_reserveActiveBytes = desiredsize;
                this->m_reserveActiveLargeBlock = newBlock;
            }

            return newBlock->BlockData;
        }